

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

Real M_GetVal(Matrix *M,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  Real RVar2;
  
  LVar1 = LASResult();
  RVar2 = 0.0;
  if (LVar1 == LASOK) {
    if (((RoC == 0 || M->ElOrder != Rowws) || (M->RowDim < RoC)) &&
       ((M->ElOrder != Clmws || RoC == 0 || ((M->ClmDim < RoC || (M->Len[RoC] <= Entry)))))) {
      LASError(LASRangeErr,"M_GetVal",M->Name,(char *)0x0,(char *)0x0);
      RVar2 = 0.0;
    }
    else {
      RVar2 = M->El[RoC][Entry].Val;
    }
  }
  return RVar2;
}

Assistant:

Real M_GetVal(Matrix *M, size_t RoC, size_t Entry)
/* returns the value of a matrix entry */
{
    Real Val;

    if (LASResult() == LASOK)
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim) &&
            (Entry < M->Len[RoC]))) {
            Val = M->El[RoC][Entry].Val;
        } else {
            LASError(LASRangeErr, "M_GetVal", M->Name, NULL, NULL);
	    Val = 0.0;
	}
    else
        Val = 0.0;
    return(Val);
}